

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::initTexture(ShaderTextureFunctionCase *this)

{
  undefined8 uVar1;
  Function FVar2;
  TextureType TVar3;
  int iVar4;
  int iVar5;
  Texture2D *this_00;
  TextureCube *this_01;
  int iVar6;
  int level;
  long lVar7;
  int iVar8;
  long lVar9;
  IVec4 *a;
  long lVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  CubeFaceFloatCoords CVar15;
  CubeFaceFloatCoords CVar16;
  CubeFaceFloatCoords CVar17;
  Vec2 f;
  Vector<float,_4> local_154;
  IVec2 viewportSize;
  Vec4 colorB_1;
  Vec4 cBias;
  Vector<float,_4> local_f0;
  Vec4 cScale;
  Vec4 colorB;
  Vec4 colorA;
  TextureFormat texFmt;
  TextureFormatInfo fmtInfo;
  
  if (initTexture()::texCubeSwz == '\0') {
    iVar11 = __cxa_guard_acquire(&initTexture()::texCubeSwz);
    if (iVar11 != 0) {
      initTexture::texCubeSwz[0].m_data[0] = _DAT_005ba240;
      initTexture::texCubeSwz[0].m_data[1] = _UNK_005ba244;
      initTexture::texCubeSwz[0].m_data[2] = _UNK_005ba248;
      initTexture::texCubeSwz[0].m_data[3] = _UNK_005ba24c;
      initTexture::texCubeSwz[1].m_data = (int  [4])ZEXT816(0x100000001);
      initTexture::texCubeSwz[2].m_data[0] = _DAT_005ba260;
      initTexture::texCubeSwz[2].m_data[1] = _UNK_005ba264;
      initTexture::texCubeSwz[2].m_data[2] = _UNK_005ba268;
      initTexture::texCubeSwz[2].m_data[3] = _UNK_005ba26c;
      initTexture::texCubeSwz[3].m_data[0] = _DAT_005ba270;
      initTexture::texCubeSwz[3].m_data[1] = _UNK_005ba274;
      initTexture::texCubeSwz[3].m_data[2] = _UNK_005ba278;
      initTexture::texCubeSwz[3].m_data[3] = _UNK_005ba27c;
      initTexture::texCubeSwz[4].m_data[0] = _DAT_005ba280;
      initTexture::texCubeSwz[4].m_data[1] = _UNK_005ba284;
      initTexture::texCubeSwz[4].m_data[2] = _UNK_005ba288;
      initTexture::texCubeSwz[4].m_data[3] = _UNK_005ba28c;
      initTexture::texCubeSwz[5].m_data[0] = _DAT_005ba290;
      initTexture::texCubeSwz[5].m_data[1] = _UNK_005ba294;
      initTexture::texCubeSwz[5].m_data[2] = _UNK_005ba298;
      initTexture::texCubeSwz[5].m_data[3] = _UNK_005ba29c;
      __cxa_guard_release(&initTexture()::texCubeSwz);
    }
  }
  texFmt = glu::mapGLTransferFormat((this->m_textureSpec).format,(this->m_textureSpec).dataType);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  deqp::gls::ShaderRenderCase::getViewportSize((ShaderRenderCase *)&viewportSize);
  FVar2 = (this->m_lookupSpec).function;
  fVar12 = 1.0;
  if ((FVar2 < FUNCTION_LAST) && (fVar12 = 1.0, (0x36U >> (FVar2 & 0x1f) & 1) != 0)) {
    fVar12 = 1.0 / (this->m_lookupSpec).minCoord.m_data[FVar2 == FUNCTION_TEXTUREPROJ3 ^ 3];
  }
  TVar3 = (this->m_textureSpec).type;
  if (TVar3 == TEXTURETYPE_CUBE_MAP) {
    iVar11 = (this->m_textureSpec).numLevels + -1;
    if (iVar11 < 2) {
      iVar11 = 1;
    }
    tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
    tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
    iVar8 = (this->m_textureSpec).width;
    iVar4 = iVar8 / 4;
    iVar5 = (this->m_textureSpec).height / 4;
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
    this_01 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube
              (this_01,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).dataType,iVar8);
    this->m_textureCube = this_01;
    for (lVar7 = 0; lVar7 < (this->m_textureSpec).numLevels; lVar7 = lVar7 + 1) {
      f.m_data[0] = (float)(int)lVar7 * (1.0 / (float)iVar11);
      f.m_data[1] = 1.0 - f.m_data[0];
      iVar8 = iVar5 >> ((byte)lVar7 & 0x1f);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      lVar10 = 0;
      a = initTexture::texCubeSwz;
      for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
        tcu::operator-((tcu *)&colorA,1,a);
        local_154.m_data[0] = f.m_data[a->m_data[0]];
        local_154.m_data[1] = f.m_data[a->m_data[1]];
        local_154.m_data[2] = f.m_data[a->m_data[2]];
        local_154.m_data[3] = f.m_data[a->m_data[3]];
        tcu::operator*((tcu *)&colorB_1,&cScale,&local_154);
        tcu::operator+((tcu *)&colorB,&cBias,(Vector<float,_4> *)&colorB_1);
        local_f0.m_data[0] = f.m_data[(int)colorA.m_data[0]];
        local_f0.m_data[1] = f.m_data[(int)colorA.m_data[1]];
        local_f0.m_data[2] = f.m_data[(int)colorA.m_data[2]];
        local_f0.m_data[3] = f.m_data[(int)colorA.m_data[3]];
        tcu::operator*((tcu *)&local_154,&cScale,&local_f0);
        tcu::operator+((tcu *)&colorB_1,&cBias,&local_154);
        tcu::TextureCube::allocLevel(&this->m_textureCube->m_refTexture,(CubeFace)lVar9,(int)lVar7);
        tcu::fillWithGrid((PixelBufferAccess *)
                          (lVar7 * 0x28 +
                          *(long *)((long)&(this->m_textureCube->m_refTexture).m_access[0].
                                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar10)),
                          iVar8,&colorB,&colorB_1);
        a = a + 1;
        lVar10 = lVar10 + 0x18;
      }
    }
    glu::TextureCube::upload(this->m_textureCube);
    colorA.m_data[2] = (this->m_lookupSpec).minCoord.m_data[2] * fVar12;
    uVar1 = *(undefined8 *)(this->m_lookupSpec).minCoord.m_data;
    colorA.m_data[0] = (float)uVar1 * fVar12;
    colorA.m_data[1] = (float)((ulong)uVar1 >> 0x20) * fVar12;
    CVar15 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    colorA.m_data[2] = (this->m_lookupSpec).minCoord.m_data[2] * fVar12;
    colorA.m_data[0] = (this->m_lookupSpec).maxCoord.m_data[0] * fVar12;
    colorA.m_data[1] = (this->m_lookupSpec).minCoord.m_data[1] * fVar12;
    CVar16 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    colorA.m_data[2] = fVar12 * (this->m_lookupSpec).minCoord.m_data[2];
    colorA.m_data[0] = (this->m_lookupSpec).minCoord.m_data[0] * fVar12;
    colorA.m_data[1] = (this->m_lookupSpec).maxCoord.m_data[1] * fVar12;
    CVar17 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    fVar12 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width * (CVar16.s - CVar15.s)) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height * (CVar17.t - CVar15.t)) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar12;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_textureCube,&(this->m_textureSpec).sampler);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
    emplace_back<deqp::gls::TextureBinding>
              (&(this->super_ShaderRenderCase).m_textures,(TextureBinding *)&colorA);
  }
  else if (TVar3 == TEXTURETYPE_2D) {
    iVar11 = (this->m_textureSpec).numLevels + -1;
    if (iVar11 < 2) {
      iVar11 = 1;
    }
    tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
    tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
    iVar8 = (this->m_textureSpec).width;
    iVar5 = (this->m_textureSpec).height;
    iVar6 = iVar8 / 4;
    iVar4 = iVar5 / 4;
    if (iVar6 < iVar4) {
      iVar4 = iVar6;
    }
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).dataType,iVar8,iVar5);
    this->m_texture2D = this_00;
    lVar9 = 0;
    for (lVar7 = 0; lVar7 < (this->m_textureSpec).numLevels; lVar7 = lVar7 + 1) {
      fVar14 = (float)(int)lVar7 * (1.0 / (float)iVar11);
      fVar13 = 1.0 - fVar14;
      colorB_1.m_data[0] = fVar14;
      colorB_1.m_data[1] = fVar13;
      colorB_1.m_data[2] = fVar14;
      colorB_1.m_data[3] = fVar13;
      tcu::operator*((tcu *)&colorB,&cScale,(Vector<float,_4> *)&colorB_1);
      tcu::operator+((tcu *)&colorA,&cBias,(Vector<float,_4> *)&colorB);
      local_154.m_data[0] = fVar13;
      local_154.m_data[1] = fVar14;
      local_154.m_data[2] = fVar13;
      local_154.m_data[3] = fVar14;
      tcu::operator*((tcu *)&colorB_1,&cScale,&local_154);
      tcu::operator+((tcu *)&colorB,&cBias,(Vector<float,_4> *)&colorB_1);
      tcu::Texture2D::allocLevel(&this->m_texture2D->m_refTexture,(int)lVar7);
      iVar8 = iVar4 >> ((byte)lVar7 & 0x1f);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      tcu::fillWithGrid((PixelBufferAccess *)
                        ((long)(((this->m_texture2D->m_refTexture).super_TextureLevelPyramid.
                                 m_access.
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8),iVar8,
                        &colorA,&colorB);
      lVar9 = lVar9 + 0x28;
    }
    (*this->m_texture2D->_vptr_Texture2D[2])();
    fVar12 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar12) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height *
                        ((this->m_lookupSpec).maxCoord.m_data[1] -
                        (this->m_lookupSpec).minCoord.m_data[1]) * fVar12) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar12;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture2D,&(this->m_textureSpec).sampler);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
    emplace_back<deqp::gls::TextureBinding>
              (&(this->super_ShaderRenderCase).m_textures,(TextureBinding *)&colorA);
  }
  *(undefined8 *)(this->m_lookupParams).scale.m_data = fmtInfo.lookupScale.m_data._0_8_;
  *(undefined8 *)((this->m_lookupParams).scale.m_data + 2) = fmtInfo.lookupScale.m_data._8_8_;
  *(undefined8 *)(this->m_lookupParams).bias.m_data = fmtInfo.lookupBias.m_data._0_8_;
  *(undefined8 *)((this->m_lookupParams).bias.m_data + 2) = fmtInfo.lookupBias.m_data._8_8_;
  return;
}

Assistant:

void ShaderTextureFunctionCase::initTexture (void)
{
	static const IVec4 texCubeSwz[] =
	{
		IVec4(0,0,1,1),
		IVec4(1,1,0,0),
		IVec4(0,1,0,1),
		IVec4(1,0,1,0),
		IVec4(0,1,1,0),
		IVec4(1,0,0,1)
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(texCubeSwz) == tcu::CUBEFACE_LAST);

	tcu::TextureFormat		texFmt			= glu::mapGLTransferFormat(m_textureSpec.format, m_textureSpec.dataType);
	tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	tcu::IVec2				viewportSize	= getViewportSize();
	bool					isProj			= functionHasProj(m_lookupSpec.function);
	float					proj			= isProj ? 1.0f/m_lookupSpec.minCoord[m_lookupSpec.function == FUNCTION_TEXTUREPROJ3 ? 2 : 3] : 1.0f;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:
		{
			float	cStep			= 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2D = new glu::Texture2D(m_renderCtx, m_textureSpec.format, m_textureSpec.dataType, m_textureSpec.width, m_textureSpec.height);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*cStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture2D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture2D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture2D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = glu::TextureTestUtil::computeLodFromDerivates(glu::TextureTestUtil::LODMODE_EXACT, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2D, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			float	cStep			= 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			DE_ASSERT(m_textureSpec.width == m_textureSpec.height);
			m_textureCube = new glu::TextureCube(m_renderCtx, m_textureSpec.format, m_textureSpec.dataType, m_textureSpec.width);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*cStep;
				float	fB		= 1.0f-fA;
				Vec2	f		(fA, fB);

				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				{
					const IVec4&	swzA	= texCubeSwz[face];
					IVec4			swzB	= 1-swzA;
					Vec4			colorA	= cBias + cScale*f.swizzle(swzA[0], swzA[1], swzA[2], swzA[3]);
					Vec4			colorB	= cBias + cScale*f.swizzle(swzB[0], swzB[1], swzB[2], swzB[3]);

					m_textureCube->getRefTexture().allocLevel((tcu::CubeFace)face, level);
					tcu::fillWithGrid(m_textureCube->getRefTexture().getLevelFace(level, (tcu::CubeFace)face), de::max(1, baseCellSize>>level), colorA, colorB);
				}
			}
			m_textureCube->upload();

			// Compute LOD \note Assumes that only single side is accessed and R is constant major axis.
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[2] - m_lookupSpec.maxCoord[2]) < 0.005);
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[0]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[0]) < de::abs(m_lookupSpec.minCoord[2]));
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[1]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[1]) < de::abs(m_lookupSpec.minCoord[2]));

			tcu::CubeFaceFloatCoords	c00		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c10		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.maxCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c01		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.maxCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			float						dudx	= (c10.s - c00.s)*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float						dvdy	= (c01.t - c00.t)*(float)m_textureSpec.height	/ (float)viewportSize[1];

			m_lookupParams.lod = glu::TextureTestUtil::computeLodFromDerivates(glu::TextureTestUtil::LODMODE_EXACT, dudx, 0.0f, 0.0f, dvdy);

			m_textures.push_back(gls::TextureBinding(m_textureCube, m_textureSpec.sampler));
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Set lookup scale & bias
	m_lookupParams.scale	= fmtInfo.lookupScale;
	m_lookupParams.bias		= fmtInfo.lookupBias;
}